

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestSuite::TestSuite
          (TestSuite *this,string *a_name,char *a_type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 in_RCX;
  long in_RDX;
  string *in_RSI;
  char *in_RDI;
  string *this_01;
  TestResult *this_02;
  undefined8 in_R8;
  pointer in_stack_ffffffffffffff68;
  unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  allocator<char> local_42;
  undefined1 local_41;
  void *local_40;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  
  *(undefined ***)in_RDI = &PTR__TestSuite_001fac38;
  this_01 = (string *)(in_RDI + 8);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string(this_01,in_RSI);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x28);
  local_41 = 0;
  if (local_18 != 0) {
    local_40 = operator_new(0x20);
    local_41 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,(allocator<char> *)this_01);
  }
  local_41 = 0;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (local_18 != 0) {
    std::allocator<char>::~allocator(&local_42);
  }
  this_02 = (TestResult *)(in_RDI + 0x30);
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::vector
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)0x18e2a6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18e2b9);
  *(undefined8 *)(in_RDI + 0x60) = local_20;
  *(undefined8 *)(in_RDI + 0x68) = local_28;
  in_RDI[0x70] = '\0';
  in_RDI[0x78] = '\0';
  in_RDI[0x79] = '\0';
  in_RDI[0x7a] = '\0';
  in_RDI[0x7b] = '\0';
  in_RDI[0x7c] = '\0';
  in_RDI[0x7d] = '\0';
  in_RDI[0x7e] = '\0';
  in_RDI[0x7f] = '\0';
  in_RDI[0x80] = '\0';
  in_RDI[0x81] = '\0';
  in_RDI[0x82] = '\0';
  in_RDI[0x83] = '\0';
  in_RDI[0x84] = '\0';
  in_RDI[0x85] = '\0';
  in_RDI[0x86] = '\0';
  in_RDI[0x87] = '\0';
  TestResult::TestResult(this_02);
  return;
}

Assistant:

TestSuite::TestSuite(const std::string& a_name, const char* a_type_param,
                     internal::SetUpTestSuiteFunc set_up_tc,
                     internal::TearDownTestSuiteFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      start_timestamp_(0),
      elapsed_time_(0) {}